

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O1

void __thiscall PF_BufferMgr::PF_BufferMgr(PF_BufferMgr *this,int _numPages)

{
  int iVar1;
  PF_BufPageDesc *pPVar2;
  int iVar3;
  PF_BufPageDesc *pPVar4;
  long lVar5;
  void *__s;
  int iVar6;
  ulong uVar7;
  long lVar8;
  
  PF_HashTable::PF_HashTable(&this->hashTable,0x14);
  this->numPages = _numPages;
  this->pageSize = 0x1000;
  pStatisticsMgr = (StatisticsMgr *)operator_new(0x28);
  (pStatisticsMgr->llStats).iLength = 0;
  (pStatisticsMgr->llStats).pnHead = (InternalNode *)0x0;
  (pStatisticsMgr->llStats).pnTail = (InternalNode *)0x0;
  (pStatisticsMgr->llStats).pnLastRef = (InternalNode *)0x0;
  (pStatisticsMgr->llStats).iLastRef = -1;
  uVar7 = 0xffffffffffffffff;
  if (-1 < _numPages) {
    uVar7 = (long)_numPages << 5;
  }
  pPVar4 = (PF_BufPageDesc *)operator_new__(uVar7);
  this->bufTable = pPVar4;
  lVar5 = (long)this->numPages;
  if (0 < lVar5) {
    iVar1 = this->pageSize;
    iVar6 = -1;
    iVar3 = -1;
    if (-1 < iVar1) {
      iVar3 = iVar1;
    }
    pPVar2 = this->bufTable;
    lVar8 = 0;
    do {
      __s = operator_new__((long)iVar3);
      *(void **)((long)&pPVar2->pData + lVar8) = __s;
      memset(__s,0,(long)iVar1);
      *(int *)((long)&pPVar2->prev + lVar8) = iVar6;
      *(int *)((long)&pPVar2->next + lVar8) = iVar6 + 2;
      iVar6 = iVar6 + 1;
      lVar8 = lVar8 + 0x20;
    } while (lVar5 << 5 != lVar8);
  }
  pPVar4[lVar5 + -1].next = -1;
  pPVar4->prev = -1;
  this->free = 0;
  this->first = -1;
  this->last = -1;
  return;
}

Assistant:

PF_BufferMgr::PF_BufferMgr(int _numPages) : hashTable(PF_HASH_TBL_SIZE)
{
   // Initialize local variables
   this->numPages = _numPages;
   pageSize = PF_PAGE_SIZE + sizeof(PF_PageHdr);

#ifdef PF_STATS
   // Initialize the global variable for the statistics manager
   pStatisticsMgr = new StatisticsMgr();
#endif

#ifdef PF_LOG
   char psMessage[100];
   sprintf (psMessage, "Creating buffer manager. %d pages of size %d.\n",
         numPages, PF_PAGE_SIZE+sizeof(PF_PageHdr));
   WriteLog(psMessage);
#endif

   // Allocate memory for buffer page description table
   bufTable = new PF_BufPageDesc[numPages];

   // Initialize the buffer table and allocate memory for buffer pages.
   // Initially, the free list contains all pages
   for (int i = 0; i < numPages; i++) {
      if ((bufTable[i].pData = new char[pageSize]) == NULL) {
         cerr << "Not enough memory for buffer\n";
         exit(1);
      }

      memset ((void *)bufTable[i].pData, 0, pageSize);

      bufTable[i].prev = i - 1;
      bufTable[i].next = i + 1;
   }
   bufTable[0].prev = bufTable[numPages - 1].next = INVALID_SLOT;
   free = 0;
   first = last = INVALID_SLOT;

#ifdef PF_LOG
   WriteLog("Succesfully created the buffer manager.\n");
#endif
}